

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

void __thiscall libchars::commands::add_commands_from_set(commands *this,command_set *C_set)

{
  _Rb_tree<libchars::command*,libchars::command*,std::_Identity<libchars::command*>,libchars::command_sort_criteria,std::allocator<libchars::command*>>
  *this_00;
  command *pcVar1;
  debug *this_01;
  token *ptVar2;
  command_node *pcVar3;
  bool bVar4;
  double __x;
  _Head_base<0UL,_libchars::token_*,_false> local_48;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> Tadd;
  command *local_38;
  command *cmd;
  
  this_01 = debug::initialize(0);
  Tadd._M_t.super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t.
  super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
  super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl =
       (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)
       (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)this;
  debug::log(this_01,__x);
  if ((C_set->C_list != (command *)0x0 & C_set->active) == 1) {
    this_00 = (_Rb_tree<libchars::command*,libchars::command*,std::_Identity<libchars::command*>,libchars::command_sort_criteria,std::allocator<libchars::command*>>
               *)((long)Tadd._M_t.
                        super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                        .super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl + 0x4080);
    local_38 = C_set->C_list;
    do {
      pcVar1 = local_38->next;
      ptVar2 = libchars::lexer(&local_38->cmd_str);
      local_48._M_head_impl = ptVar2;
      if (ptVar2 != (token *)0x0) {
        pcVar3 = command_node::add(&this->root,&ptVar2->value,local_38->mask,local_38->hidden);
        ptVar2 = ptVar2->next;
        bVar4 = pcVar3 != (command_node *)0x0;
        if (bVar4 && ptVar2 != (token *)0x0) {
          do {
            pcVar3 = command_node::add_root(pcVar3,local_38->mask,local_38->hidden);
            if (pcVar3 == (command_node *)0x0) {
              pcVar3 = (command_node *)0x0;
            }
            else {
              pcVar3 = command_node::add(pcVar3,&ptVar2->value,local_38->mask,local_38->hidden);
              ptVar2 = ptVar2->next;
            }
            bVar4 = pcVar3 != (command_node *)0x0;
          } while ((bVar4) && (ptVar2 != (token *)0x0));
        }
        if (bVar4) {
          *(undefined1 *)
           ((long)Tadd._M_t.
                  super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t
                  .super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
                  super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl + 0x415c) = 1;
          if (pcVar3->cmd != (command *)0x0) {
            __assert_fail("cmd == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/roelfdutoit[P]libchars/commands.cpp"
                          ,0x104,"void libchars::command_node::associate(command *)");
          }
          pcVar3->cmd = local_38;
          std::
          _Rb_tree<libchars::command*,libchars::command*,std::_Identity<libchars::command*>,libchars::command_sort_criteria,std::allocator<libchars::command*>>
          ::_M_insert_unique<libchars::command*const&>(this_00,&local_38);
        }
      }
      std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::~unique_ptr
                ((unique_ptr<libchars::token,_std::default_delete<libchars::token>_> *)&local_48);
      local_38 = pcVar1;
    } while (pcVar1 != (command *)0x0);
  }
  return;
}

Assistant:

void commands::add_commands_from_set(command_set &C_set)
    {
        LC_LOG_VERBOSE("set[%p] root[%p]",&C_set,&root);
        command *C_list = C_set.get();
        while (C_list != NULL) {
            command *cmd = C_list;
            C_list = C_list->next;
            // break command string into tokens
            std::unique_ptr<token> Tadd(libchars::lexer(cmd->cmd_str));
            if (Tadd.get() == NULL)
                continue;
            // add command word(s) to dictionary
            token *T = Tadd.get();
            command_node *cnode = root.add(T->value,cmd->mask,cmd->hidden);
            T = T->next;
            while (T != NULL && cnode != NULL) {
                if ((cnode = cnode->add_root(cmd->mask,cmd->hidden)) != NULL) {
                    cnode = cnode->add(T->value,cmd->mask,cmd->hidden);
                    T = T->next;
                }
            }
            // associate dictionary node with command
            if (cnode != NULL) {
                dirty = true;
                cnode->associate(cmd);
                C_sorted.insert(cmd);
            }
        }
    }